

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_bilinear.h
# Opt level: O2

void __thiscall
ncnn::linear_coeffs(ncnn *this,int w,int outw,int *xofs,float *alpha,int align_corner)

{
  undefined4 in_register_00000014;
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  undefined8 in_XMM0_Qa;
  double dVar5;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar6 [16];
  
  iVar2 = (int)this;
  if ((int)alpha == 0) {
    dVar5 = (double)iVar2 / (double)w;
  }
  else {
    dVar5 = (double)(iVar2 + -1) / (double)(w + -1);
  }
  auVar6._8_8_ = in_XMM0_Qa;
  auVar6._0_8_ = dVar5;
  uVar1 = (ulong)(uint)w;
  if (w < 1) {
    uVar1 = 0;
  }
  for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (double)(int)uVar3 + 0.5;
    auVar9 = vfmadd213sd_fma(auVar8,auVar6,ZEXT816(0xbfe0000000000000));
    if ((int)alpha != 0) {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = dVar5 * (double)(int)uVar3;
    }
    auVar10._0_4_ = (float)auVar9._0_8_;
    auVar10._4_12_ = auVar9._4_12_;
    auVar9 = vroundss_avx(auVar10,auVar10,9);
    iVar4 = (int)auVar9._0_4_;
    fVar7 = 0.0;
    if (-1 < iVar4) {
      fVar7 = auVar10._0_4_ - auVar9._0_4_;
    }
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    if (iVar2 + -1 <= iVar4) {
      iVar4 = iVar2 + -2;
      fVar7 = 1.0;
    }
    *(int *)(CONCAT44(in_register_00000014,outw) + uVar3 * 4) = iVar4;
    xofs[uVar3 * 2] = (int)(1.0 - fVar7);
    xofs[uVar3 * 2 + 1] = (int)fVar7;
  }
  return;
}

Assistant:

static void linear_coeffs(int w, int outw, int* xofs, float* alpha, int align_corner)
{
    double scale = (double)w / outw;
    if (align_corner)
    {
        scale = (double)(w - 1) / (outw - 1);
    }

    for (int dx = 0; dx < outw; dx++)
    {
        float fx = (float)((dx + 0.5) * scale - 0.5);
        if (align_corner)
        {
            fx = (float)(dx * scale);
        }

        int sx = floor(fx);
        fx -= sx;

        if (sx < 0)
        {
            sx = 0;
            fx = 0.f;
        }
        if (sx >= w - 1)
        {
            sx = w - 2;
            fx = 1.f;
        }

        xofs[dx] = sx;

        alpha[dx * 2] = 1.f - fx;
        alpha[dx * 2 + 1] = fx;
    }
}